

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::InflationStream::inflate
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *__return_storage_ptr__
          ,InflationStream *this,ZlibContext *zlibContext,string_view compressed,
          size_t maxPayloadLength)

{
  string *psVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong local_40;
  pointer local_38;
  
  psVar1 = &zlibContext->dynamicInflationBuffer;
  (zlibContext->dynamicInflationBuffer)._M_string_length = 0;
  *(zlibContext->dynamicInflationBuffer)._M_dataplus._M_p = '\0';
  (this->inflationStream).next_in = (Bytef *)compressed._M_str;
  (this->inflationStream).avail_in = (uInt)compressed._M_len;
  do {
    (this->inflationStream).next_out = (Bytef *)zlibContext->inflationBuffer;
    (this->inflationStream).avail_out = 0x4000;
    iVar3 = ::inflate(this,2);
    if ((this->inflationStream).avail_out != 0 && iVar3 == 0) {
      inflateReset(this);
      goto LAB_0016b887;
    }
    std::__cxx11::string::append((char *)psVar1,(ulong)zlibContext->inflationBuffer);
  } while (((this->inflationStream).avail_out == 0) &&
          ((zlibContext->dynamicInflationBuffer)._M_string_length <= maxPayloadLength));
  inflateReset(this);
  if ((iVar3 == 0) || (iVar3 == -5)) {
LAB_0016b887:
    uVar4 = (zlibContext->dynamicInflationBuffer)._M_string_length;
    if (uVar4 <= maxPayloadLength) {
      if (uVar4 == 0) {
        uVar4 = (ulong)(0x4000 - (this->inflationStream).avail_out);
        if (uVar4 <= maxPayloadLength) {
          pcVar2 = zlibContext->inflationBuffer;
          (__return_storage_ptr__->first)._M_len = uVar4;
          (__return_storage_ptr__->first)._M_str = pcVar2;
          __return_storage_ptr__->second = true;
          return __return_storage_ptr__;
        }
      }
      else {
        std::__cxx11::string::append((char *)psVar1,(ulong)zlibContext->inflationBuffer);
        local_40 = (zlibContext->dynamicInflationBuffer)._M_string_length;
        if (local_40 <= maxPayloadLength) {
          local_38 = (psVar1->_M_dataplus)._M_p;
          std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::
          pair<char_*,_unsigned_long,_true>(__return_storage_ptr__,&local_38,&local_40);
          return __return_storage_ptr__;
        }
      }
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      __return_storage_ptr__->second = false;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  __return_storage_ptr__->second = false;
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string_view, bool> inflate(ZlibContext *zlibContext, std::string_view compressed, size_t maxPayloadLength) {

        /* We clear this one here, could be done better */
        zlibContext->dynamicInflationBuffer.clear();

        inflationStream.next_in = (Bytef *) compressed.data();
        inflationStream.avail_in = (unsigned int) compressed.length();

        int err;
        do {
            inflationStream.next_out = (Bytef *) zlibContext->inflationBuffer;
            inflationStream.avail_out = LARGE_BUFFER_SIZE;

            err = ::inflate(&inflationStream, Z_SYNC_FLUSH);
            if (err == Z_OK && inflationStream.avail_out) {
                break;
            }

            zlibContext->dynamicInflationBuffer.append(zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out);


        } while (inflationStream.avail_out == 0 && zlibContext->dynamicInflationBuffer.length() <= maxPayloadLength);

        inflateReset(&inflationStream);

        if ((err != Z_BUF_ERROR && err != Z_OK) || zlibContext->dynamicInflationBuffer.length() > maxPayloadLength) {
            return {{nullptr, 0}, false};
        }

        if (zlibContext->dynamicInflationBuffer.length()) {
            zlibContext->dynamicInflationBuffer.append(zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out);

            /* Let's be strict about the max size */
            if (zlibContext->dynamicInflationBuffer.length() > maxPayloadLength) {
                return {{nullptr, 0}, false};
            }

            return {zlibContext->dynamicInflationBuffer.data(), zlibContext->dynamicInflationBuffer.length()};
        }

        /* Let's be strict about the max size */
        if ((LARGE_BUFFER_SIZE - inflationStream.avail_out) > maxPayloadLength) {
            return {{nullptr, 0}, false};
        }

        return {{zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out}, true};
    }